

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O0

void __thiscall
FastPForLib::PFor2008::encodeArray
          (PFor2008 *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  undefined4 *in_RCX;
  long in_RDX;
  undefined8 *in_R8;
  size_t thisnvalue;
  size_t l;
  size_t i;
  size_t j;
  size_t totalnvalue;
  uint32_t maxsize;
  size_t *in_stack_00000070;
  uint32_t *in_stack_00000078;
  size_t in_stack_00000080;
  uint32_t *in_stack_00000088;
  PFor2008 *in_stack_00000090;
  ulong local_40;
  undefined8 local_38;
  
  *in_RCX = (int)in_RDX;
  local_38 = 1;
  for (local_40 = 0; local_40 < in_RDX + 0xffffffU >> 0x18; local_40 = local_40 + 1) {
    local_38 = *in_R8;
    __encodeArray(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                  in_stack_00000070);
  }
  *in_R8 = local_38;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t len, uint32_t *out,
                   size_t &nvalue) override {
    *out++ = static_cast<uint32_t>(len);
#ifndef NDEBUG
    const uint32_t *const finalin(in + len);
#endif
    const uint32_t maxsize = (1U << (32 - blocksizeinbits - 1));
    size_t totalnvalue(1);
    // for (size_t i = 0; i < len; i += maxsize)
    for (size_t j = 0; j < (len + maxsize - 1U) / maxsize; ++j) {
      size_t i = j << (32 - blocksizeinbits - 1);
      size_t l = maxsize;
      if (i + maxsize > len) {
        l = len - i;
        assert(l <= maxsize);
      }
      size_t thisnvalue = nvalue - totalnvalue;
      assert(in + i + l <= finalin);
      __encodeArray(&in[i], l, out, thisnvalue);
      totalnvalue += thisnvalue;
      assert(totalnvalue <= nvalue);
      out += thisnvalue;
    }
    nvalue = totalnvalue;
  }